

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O0

Diagnostics * __thiscall
slang::analysis::AnalysisManager::getDiagnostics(AnalysisManager *this,SourceManager *sourceManager)

{
  bool bVar1;
  iterator diag_00;
  iterator isNew;
  reference pWVar2;
  Diagnostics *this_00;
  iterator pDVar3;
  AnalysisManager *in_RSI;
  Diagnostic *in_RDI;
  bool _;
  Diagnostic *diag;
  iterator __end3;
  iterator __begin3;
  Diagnostics *__range3;
  WorkerState *state;
  iterator __end2;
  iterator __begin2;
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  *__range2;
  ASTDiagMap diagMap;
  SourceManager *in_stack_00000210;
  ASTDiagMap *in_stack_00000218;
  Diagnostic *this_01;
  Diagnostic *in_stack_fffffffffffffef8;
  Diagnostic *in_stack_ffffffffffffff00;
  iterator local_78;
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  *this_02;
  
  this_01 = in_RDI;
  wait(in_RSI,in_RSI);
  slang::ast::ASTDiagMap::ASTDiagMap((ASTDiagMap *)0x9a387a);
  this_02 = &in_RSI->workerStates;
  diag_00 = std::
            vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
            ::begin((vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
                     *)in_RDI);
  isNew = std::
          vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
          ::end((vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
                 *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
                      ((__normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
                        *)this_01,
                       (__normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pWVar2 = __gnu_cxx::
             __normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
             ::operator*((__normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
                          *)&stack0xffffffffffffffa8);
    this_00 = &(pWVar2->context).diagnostics;
    local_78 = SmallVectorBase<slang::Diagnostic>::begin
                         ((SmallVectorBase<slang::Diagnostic> *)this_00);
    pDVar3 = SmallVectorBase<slang::Diagnostic>::end((SmallVectorBase<slang::Diagnostic> *)this_00);
    for (; local_78 != pDVar3; local_78 = local_78 + 1) {
      Diagnostic::Diagnostic(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      slang::ast::ASTDiagMap::add
                ((ASTDiagMap *)this_02,(Diagnostic *)diag_00._M_current,(bool *)isNew._M_current);
      Diagnostic::~Diagnostic(this_01);
    }
    __gnu_cxx::
    __normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
    ::operator++((__normal_iterator<slang::analysis::AnalysisManager::WorkerState_*,_std::vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  slang::ast::ASTDiagMap::coalesce(in_stack_00000218,in_stack_00000210);
  slang::ast::ASTDiagMap::~ASTDiagMap((ASTDiagMap *)0x9a3a04);
  return (Diagnostics *)this_01;
}

Assistant:

Diagnostics AnalysisManager::getDiagnostics(const SourceManager* sourceManager) {
    wait();

    ASTDiagMap diagMap;
    for (auto& state : workerStates) {
        for (auto& diag : state.context.diagnostics) {
            bool _;
            diagMap.add(diag, _);
        }
    }

    return diagMap.coalesce(sourceManager);
}